

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  int iVar1;
  bool bVar2;
  Result RVar3;
  reference pvVar4;
  reference ppEVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pEVar9;
  ulong uVar10;
  size_type sVar11;
  Catch *catch__1;
  iterator local_1c0;
  reference local_1b0;
  value_type *iter_6;
  TryExpr *pTStack_1a0;
  Index catch_index;
  TryExpr *try_expr_1;
  Enum local_190;
  Enum local_18c;
  reference local_188;
  Catch *catch_;
  iterator local_170;
  reference local_160;
  value_type *iter_5;
  TryExpr *try_expr;
  iterator local_148;
  iterator local_138;
  reference local_128;
  value_type *iter_4;
  TryTableExpr *try_table_expr;
  iterator local_110;
  iterator local_100;
  reference local_f0;
  value_type *iter_3;
  BlockExprBase<(wabt::ExprType)27> *loop_expr;
  iterator local_d8;
  iterator local_c8;
  reference local_b8;
  value_type *iter_2;
  IfExpr *if_expr_1;
  iterator local_a0;
  iterator local_90;
  reference local_80;
  value_type *iter_1;
  IfExpr *if_expr;
  iterator local_68;
  iterator local_58;
  reference local_48;
  value_type *iter;
  BlockExprBase<(wabt::ExprType)8> *block_expr;
  Expr *local_30;
  Expr *expr;
  Expr *pEStack_20;
  State state;
  Expr *root_expr_local;
  ExprVisitor *this_local;
  
  pEStack_20 = root_expr;
  root_expr_local = (Expr *)this;
  std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::clear
            (&this->state_stack_);
  std::vector<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>::clear(&this->expr_stack_);
  std::
  vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ::clear(&this->expr_iter_stack_);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->catch_index_stack_);
  PushDefault(this,pEStack_20);
  do {
    bVar2 = std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::empty
                      (&this->state_stack_);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    pvVar4 = std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::back
                       (&this->state_stack_);
    expr._4_4_ = *pvVar4;
    ppEVar5 = std::vector<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>::back(&this->expr_stack_);
    local_30 = *ppEVar5;
    switch(expr._4_4_) {
    case Default:
      PopDefault(this);
      block_expr._4_4_ = HandleDefaultState(this,local_30);
      bVar2 = Failed(block_expr._4_4_);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      break;
    case Block:
      iter = (value_type *)cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(local_30);
      pvVar7 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_48 = pvVar7;
      local_58 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter + 0xe));
      bVar2 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar7,local_58);
      if (bVar2) {
        local_68 = intrusive_list<wabt::Expr>::iterator::operator++(local_48,0);
        pEVar9 = intrusive_list<wabt::Expr>::iterator::operator*(&local_68);
        PushDefault(this,pEVar9);
      }
      else {
        if_expr._4_4_ = (*this->delegate_->_vptr_Delegate[4])();
        bVar2 = Failed(if_expr._4_4_);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
      }
      break;
    case IfTrue:
      iter_1 = (value_type *)cast<wabt::IfExpr,wabt::Expr>(local_30);
      pvVar7 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_80 = pvVar7;
      local_90 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter_1 + 0xe));
      bVar2 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar7,local_90);
      if (bVar2) {
        local_a0 = intrusive_list<wabt::Expr>::iterator::operator++(local_80,0);
        pEVar9 = intrusive_list<wabt::Expr>::iterator::operator*(&local_a0);
        PushDefault(this,pEVar9);
      }
      else {
        if_expr_1._4_4_ = (*this->delegate_->_vptr_Delegate[0x15])(this->delegate_,iter_1);
        bVar2 = Failed(if_expr_1._4_4_);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
        PushExprlist(this,IfFalse,local_30,(ExprList *)&iter_1[0x11].node_);
      }
      break;
    case IfFalse:
      iter_2 = (value_type *)cast<wabt::IfExpr,wabt::Expr>(local_30);
      pvVar7 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_b8 = pvVar7;
      local_c8 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)&iter_2[0x11].node_);
      bVar2 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar7,local_c8);
      if (bVar2) {
        local_d8 = intrusive_list<wabt::Expr>::iterator::operator++(local_b8,0);
        pEVar9 = intrusive_list<wabt::Expr>::iterator::operator*(&local_d8);
        PushDefault(this,pEVar9);
      }
      else {
        loop_expr._4_4_ = (*this->delegate_->_vptr_Delegate[0x16])();
        bVar2 = Failed(loop_expr._4_4_);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
      }
      break;
    case Loop:
      iter_3 = (value_type *)cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(local_30);
      pvVar7 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_f0 = pvVar7;
      local_100 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter_3 + 0xe));
      bVar2 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar7,local_100);
      if (bVar2) {
        local_110 = intrusive_list<wabt::Expr>::iterator::operator++(local_f0,0);
        pEVar9 = intrusive_list<wabt::Expr>::iterator::operator*(&local_110);
        PushDefault(this,pEVar9);
      }
      else {
        try_table_expr._4_4_ = (*this->delegate_->_vptr_Delegate[0x1c])();
        bVar2 = Failed(try_table_expr._4_4_);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
      }
      break;
    case Try:
      iter_5 = (value_type *)cast<wabt::TryExpr,wabt::Expr>(local_30);
      pvVar7 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_160 = pvVar7;
      local_170 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter_5 + 0xe));
      bVar2 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar7,local_170);
      if (bVar2) {
        _catch_ = intrusive_list<wabt::Expr>::iterator::operator++(local_160,0);
        pEVar9 = intrusive_list<wabt::Expr>::iterator::operator*((iterator *)&catch_);
        PushDefault(this,pEVar9);
      }
      else {
        PopExprlist(this);
        iVar1 = *(int *)((long)&iter_5[3].node_ + 4);
        if (iVar1 == 0) {
          try_expr_1._0_4_ = (*this->delegate_->_vptr_Delegate[0x39])();
          bVar2 = Failed(try_expr_1._0_4_);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        else if (iVar1 == 1) {
          bVar2 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::empty
                            ((vector<wabt::Catch,_std::allocator<wabt::Catch>_> *)
                             &iter_5[0x11].node_);
          if (bVar2) {
            local_190 = (*this->delegate_->_vptr_Delegate[0x39])();
            bVar2 = Failed((Result)local_190);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
          }
          else {
            local_188 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::operator[]
                                  ((vector<wabt::Catch,_std::allocator<wabt::Catch>_> *)
                                   &iter_5[0x11].node_,0);
            local_18c = (*this->delegate_->_vptr_Delegate[0x37])(this->delegate_,iter_5,local_188);
            bVar2 = Failed((Result)local_18c);
            if (bVar2) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            PushCatch(this,local_30,0,&local_188->exprs);
          }
        }
        else if (iVar1 == 2) {
          try_expr_1._4_4_ = (*this->delegate_->_vptr_Delegate[0x38])();
          bVar2 = Failed(try_expr_1._4_4_);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
      }
      break;
    case TryTable:
      iter_4 = (value_type *)cast<wabt::TryTableExpr,wabt::Expr>(local_30);
      pvVar7 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_128 = pvVar7;
      local_138 = intrusive_list<wabt::Expr>::end((intrusive_list<wabt::Expr> *)(iter_4 + 0xe));
      bVar2 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar7,local_138);
      if (bVar2) {
        local_148 = intrusive_list<wabt::Expr>::iterator::operator++(local_128,0);
        pEVar9 = intrusive_list<wabt::Expr>::iterator::operator*(&local_148);
        PushDefault(this,pEVar9);
      }
      else {
        try_expr._4_4_ = (*this->delegate_->_vptr_Delegate[9])();
        bVar2 = Failed(try_expr._4_4_);
        if (bVar2) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        PopExprlist(this);
      }
      break;
    case Catch:
      pTStack_1a0 = cast<wabt::TryExpr,wabt::Expr>(local_30);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                         (&this->catch_index_stack_);
      iter_6._4_4_ = *pvVar6;
      pvVar7 = std::
               vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ::back(&this->expr_iter_stack_);
      local_1b0 = pvVar7;
      pvVar8 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::operator[]
                         (&pTStack_1a0->catches,(ulong)iter_6._4_4_);
      local_1c0 = intrusive_list<wabt::Expr>::end(&pvVar8->exprs);
      bVar2 = intrusive_list<wabt::Expr>::iterator::operator!=(pvVar7,local_1c0);
      if (bVar2) {
        _catch__1 = intrusive_list<wabt::Expr>::iterator::operator++(local_1b0,0);
        pEVar9 = intrusive_list<wabt::Expr>::iterator::operator*((iterator *)&catch__1);
        PushDefault(this,pEVar9);
      }
      else {
        PopCatch(this);
        iter_6._4_4_ = iter_6._4_4_ + 1;
        uVar10 = (ulong)iter_6._4_4_;
        sVar11 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::size(&pTStack_1a0->catches)
        ;
        if (uVar10 < sVar11) {
          pvVar8 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::operator[]
                             (&pTStack_1a0->catches,(ulong)iter_6._4_4_);
          RVar3.enum_ = (*this->delegate_->_vptr_Delegate[0x37])(this->delegate_,pTStack_1a0,pvVar8)
          ;
          bVar2 = Failed(RVar3);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          PushCatch(this,local_30,iter_6._4_4_,&pvVar8->exprs);
        }
        else {
          RVar3.enum_ = (*this->delegate_->_vptr_Delegate[0x39])();
          bVar2 = Failed(RVar3);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
      }
    }
  } while( true );
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();
  catch_index_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::TryTable: {
        auto try_table_expr = cast<TryTableExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_table_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndTryTableExpr(try_table_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopExprlist();
          switch (try_expr->kind) {
            case TryKind::Catch:
              if (!try_expr->catches.empty()) {
                Catch& catch_ = try_expr->catches[0];
                CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
                PushCatch(expr, 0, catch_.exprs);
              } else {
                CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              }
              break;
            case TryKind::Delegate:
              CHECK_RESULT(delegate_->OnDelegateExpr(try_expr));
              break;
            case TryKind::Plain:
              CHECK_RESULT(delegate_->EndTryExpr(try_expr));
              break;
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        Index catch_index = catch_index_stack_.back();
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catches[catch_index].exprs.end()) {
          PushDefault(&*iter++);
        } else {
          PopCatch();
          catch_index++;
          if (catch_index < try_expr->catches.size()) {
            Catch& catch_ = try_expr->catches[catch_index];
            CHECK_RESULT(delegate_->OnCatchExpr(try_expr, &catch_));
            PushCatch(expr, catch_index, catch_.exprs);
          } else {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          }
        }
        break;
      }
    }
  }

  return Result::Ok;
}